

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O1

void P_DoNewChaseDir(AActor *actor,double deltax,double deltay)

{
  byte bVar1;
  dirtype_t dVar2;
  bool bVar3;
  dirtype_t dVar4;
  uint uVar5;
  dirtype_t dVar6;
  dirtype_t dVar7;
  dirtype_t dVar8;
  ulong uVar9;
  ulong uVar10;
  bool attempts [8];
  char local_50 [8];
  double local_48;
  double local_38;
  
  local_50[0] = '\0';
  local_50[1] = '\0';
  local_50[2] = '\0';
  local_50[3] = '\0';
  local_50[4] = '\0';
  local_50[5] = '\0';
  local_50[6] = '\0';
  local_50[7] = '\0';
  bVar1 = actor->movedir;
  dVar8 = (uint)(-10.0 <= deltax) * 4 + DI_WEST;
  if (10.0 < deltax) {
    dVar8 = DI_EAST;
  }
  dVar2 = opposite[bVar1];
  uVar9 = (ulong)dVar2;
  dVar7 = DI_NODIR;
  if (10.0 < deltay) {
    dVar7 = DI_NORTH;
  }
  dVar6 = DI_SOUTH;
  if (-10.0 <= deltay) {
    dVar6 = dVar7;
  }
  if ((deltay < -10.0 || 10.0 < deltay) && (10.0 < deltax || deltax < -10.0)) {
    dVar7 = *(dirtype_t *)
             ((long)diags + (ulong)((uint)(0.0 < deltax) * 4 + (uint)(deltay < 0.0) * 8));
    dVar4 = dVar7 & 0xff;
    actor->movedir = (BYTE)dVar7;
    if (dVar4 != dVar2) {
      local_50[dVar4] = '\x01';
      local_48 = deltax;
      local_38 = deltay;
      bVar3 = P_TryWalk(actor);
      deltax = local_48;
      deltay = local_38;
      if (bVar3) {
        return;
      }
    }
  }
  dVar7 = dVar8;
  if (((actor->flags5).Value & 0x20) == 0) {
    local_48 = deltax;
    local_38 = deltay;
    uVar5 = FRandom::GenRand32(&pr_newchasedir);
    if ((200 < (uVar5 & 0xff)) || (ABS(local_48) < ABS(local_38))) {
      dVar7 = dVar6;
      dVar6 = dVar8;
    }
    if (dVar7 == dVar2) {
      dVar7 = DI_NODIR;
    }
    if (dVar6 == dVar2) {
      dVar6 = DI_NODIR;
    }
  }
  if ((dVar7 != DI_NODIR) && (local_50[dVar7] == '\0')) {
    actor->movedir = (BYTE)dVar7;
    local_50[dVar7] = '\x01';
    bVar3 = P_TryWalk(actor);
    if (bVar3) {
      return;
    }
  }
  if ((dVar6 != DI_NODIR) && (local_50[dVar6] == '\0')) {
    actor->movedir = (BYTE)dVar6;
    local_50[dVar6] = '\x01';
    bVar3 = P_TryWalk(actor);
    if (bVar3) {
      return;
    }
  }
  if (((bVar1 != 8) && (((actor->flags5).Value & 0x20) == 0)) && (local_50[bVar1] == '\0')) {
    actor->movedir = bVar1;
    local_50[bVar1] = '\x01';
    bVar3 = P_TryWalk(actor);
    if (bVar3) {
      return;
    }
  }
  uVar5 = FRandom::GenRand32(&pr_newchasedir);
  if ((uVar5 & 1) == 0) {
    uVar10 = 7;
    do {
      if ((uVar9 != uVar10) && (local_50[uVar10] == '\0')) {
        actor->movedir = (BYTE)uVar10;
        local_50[uVar10] = '\x01';
        bVar3 = P_TryWalk(actor);
        if (bVar3) {
          return;
        }
      }
      bVar3 = uVar10 != 0;
      uVar10 = uVar10 - 1;
    } while (bVar3);
  }
  else {
    uVar10 = 0;
    do {
      if ((uVar9 != uVar10) && (local_50[uVar10] == '\0')) {
        actor->movedir = (BYTE)uVar10;
        local_50[uVar10] = '\x01';
        bVar3 = P_TryWalk(actor);
        if (bVar3) {
          return;
        }
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != 8);
  }
  if ((dVar2 != DI_NODIR) && (local_50[uVar9] == '\0')) {
    actor->movedir = (BYTE)dVar2;
    bVar3 = P_TryWalk(actor);
    if (bVar3) {
      return;
    }
  }
  actor->movedir = '\b';
  return;
}

Assistant:

void P_DoNewChaseDir (AActor *actor, double deltax, double deltay)
{
	dirtype_t	d[2];
	int			tdir;
	dirtype_t	olddir, turnaround;
	bool		attempts[NUMDIRS-1]; // We don't need to attempt DI_NODIR.

	memset(&attempts, false, sizeof(attempts));
	olddir = (dirtype_t)actor->movedir;
	turnaround = opposite[olddir];

	if (deltax > 10)
		d[0] = DI_EAST;
	else if (deltax < -10)
		d[0] = DI_WEST;
	else
		d[0] = DI_NODIR;

	if (deltay < -10)
		d[1] = DI_SOUTH;
	else if (deltay>10)
		d[1] = DI_NORTH;
	else
		d[1] = DI_NODIR; 

	// try direct route
	if (d[0] != DI_NODIR && d[1] != DI_NODIR)
	{
		actor->movedir = diags[((deltay<0)<<1) + (deltax>0)];
		if (actor->movedir != turnaround)
		{
			attempts[actor->movedir] = true;
			if (P_TryWalk(actor))
				return;
		}
	}

	// try other directions
	if (!(actor->flags5 & MF5_AVOIDINGDROPOFF))
	{
		if ((pr_newchasedir() > 200 || fabs(deltay) > fabs(deltax)))
		{
			swapvalues (d[0], d[1]);
		}

		if (d[0] == turnaround)
			d[0] = DI_NODIR;
		if (d[1] == turnaround)
			d[1] = DI_NODIR;
	}
		
	if (d[0] != DI_NODIR && attempts[d[0]] == false)
	{
		actor->movedir = d[0];
		attempts[d[0]] = true;
		if (P_TryWalk (actor))
		{
			// either moved forward or attacked
			return;
		}
	}

	if (d[1] != DI_NODIR && attempts[d[1]] == false)
	{
		actor->movedir = d[1];
		attempts[d[1]] = true;
		if (P_TryWalk (actor))
			return;
	}

	if (!(actor->flags5 & MF5_AVOIDINGDROPOFF))
	{
		// there is no direct path to the player, so pick another direction.
		if (olddir != DI_NODIR && attempts[olddir] == false)
		{
			actor->movedir = olddir;
			attempts[olddir] = true;
			if (P_TryWalk (actor))
				return;
		}
	}

	// randomly determine direction of search
	if (pr_newchasedir() & 1)	
	{
		for (tdir = DI_EAST; tdir <= DI_SOUTHEAST; tdir++)
		{
			if (tdir != turnaround && attempts[tdir] == false)
			{
				actor->movedir = tdir;
				attempts[tdir] = true;
				if ( P_TryWalk(actor) )
					return;
			}
		}
	}
	else
	{
		for (tdir = DI_SOUTHEAST; tdir != (DI_EAST-1); tdir--)
		{
			if (tdir != turnaround && attempts[tdir] == false)
			{
				actor->movedir = tdir;
				attempts[tdir] = true;
				if ( P_TryWalk(actor) )
					return;
			}
		}
	}

	if (turnaround != DI_NODIR && attempts[turnaround] == false)
	{
		actor->movedir =turnaround;
		if ( P_TryWalk(actor) )
			return;
	}

	actor->movedir = DI_NODIR;	// cannot move
}